

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O2

errr run_parse_ui_entry(parser *p)

{
  ui_entry **ppuVar1;
  errr eVar2;
  wchar_t wVar3;
  ulong uVar4;
  ulong uVar5;
  
  eVar2 = parse_file(p,"ui_entry_base");
  if (eVar2 == 0) {
    wVar3 = hatch_last_embryo(p);
    ppuVar1 = entries;
    if (wVar3 == L'\0') {
      uVar5 = 0;
      uVar4 = (ulong)(uint)n_entry;
      if (n_entry < L'\x01') {
        uVar4 = uVar5;
      }
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        ppuVar1[uVar5]->flags = ppuVar1[uVar5]->flags | 0x100000;
      }
      eVar2 = parse_file(p,"ui_entry");
      return eVar2;
    }
    eVar2 = 1;
  }
  return eVar2;
}

Assistant:

static errr run_parse_ui_entry(struct parser *p)
{
	errr result = parse_file(p, "ui_entry_base");
	int i;

	if (result != 0) {
		return result;
	}
	if (hatch_last_embryo(p)) {
		return 1;
	}
	/*
	 * Mark those as templates only so they'll never be directly displayed.
	 */
	for (i = 0; i < n_entry; ++i) {
		entries[i]->flags |= ENTRY_FLAG_TEMPLATE_ONLY;
	}
	return parse_file(p, "ui_entry");
}